

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMarkers::Initialize
          (ChLinkMarkers *this,shared_ptr<chrono::ChBody> *mbody1,shared_ptr<chrono::ChBody> *mbody2
          ,bool pos_are_relative,ChCoordsys<double> *mpos1,ChCoordsys<double> *mpos2)

{
  element_type *peVar1;
  element_type *peVar2;
  ChBody *pCVar3;
  ChMarker *pCVar4;
  int iVar5;
  ChMarker *pCVar6;
  int iVar7;
  shared_ptr<chrono::ChMarker> mmark2;
  shared_ptr<chrono::ChMarker> mmark1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  ChMarker *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  ChCoordsys<double> *local_60;
  shared_ptr<chrono::ChMarker> local_58;
  shared_ptr<chrono::ChMarker> local_48;
  
  peVar1 = (mbody1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (mbody2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == peVar2) {
    __assert_fail("mbody1.get() != mbody2.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMarkers.cpp"
                  ,0x70,
                  "virtual void chrono::ChLinkMarkers::Initialize(std::shared_ptr<ChBody>, std::shared_ptr<ChBody>, bool, const ChCoordsys<> &, const ChCoordsys<> &)"
                 );
  }
  local_60 = mpos2;
  if ((peVar1->super_ChPhysicsItem).system == (peVar2->super_ChPhysicsItem).system) {
    pCVar6 = (ChMarker *)ChFrame<double>::operator_new((ChFrame<double> *)0x340,(size_t)mbody1);
    ChMarker::ChMarker(pCVar6);
    local_78 = pCVar6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChMarker*>
              (a_Stack_70,pCVar6);
    pCVar6 = (ChMarker *)ChFrame<double>::operator_new((ChFrame<double> *)0x340,(size_t)pCVar6);
    ChMarker::ChMarker(pCVar6);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChMarker*>
              (&_Stack_80,pCVar6);
    pCVar3 = (mbody1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
    local_48.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_70[0]._M_pi;
    if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (a_Stack_70[0]._M_pi)->_M_use_count = (a_Stack_70[0]._M_pi)->_M_use_count + 1;
      }
    }
    ChBody::AddMarker(pCVar3,&local_48);
    if (local_48.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pCVar3 = (mbody2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_80._M_pi;
    if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
      }
    }
    local_58.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar6;
    ChBody::AddMarker(pCVar3,&local_58);
    if (local_58.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pCVar4 = local_78;
    (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x48])
              (this,local_78,pCVar6);
    iVar7 = 0;
    iVar5 = 0;
    if (pCVar4 != (ChMarker *)0x0) {
      iVar7 = (pCVar4->super_ChObj).m_identifier;
    }
    this->markID1 = iVar7;
    if (pCVar6 != (ChMarker *)0x0) {
      iVar5 = (pCVar6->super_ChObj).m_identifier;
    }
    this->markID2 = iVar5;
    if (pos_are_relative) {
      ChMarker::Impose_Rel_Coord(local_78,mpos1);
      ChMarker::Impose_Rel_Coord(pCVar6,local_60);
    }
    else {
      ChMarker::Impose_Abs_Coord(local_78,mpos1);
      ChMarker::Impose_Abs_Coord(pCVar6,local_60);
    }
    if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
    }
    if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_70[0]._M_pi);
    }
    return;
  }
  __assert_fail("mbody1->GetSystem() == mbody2->GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMarkers.cpp"
                ,0x71,
                "virtual void chrono::ChLinkMarkers::Initialize(std::shared_ptr<ChBody>, std::shared_ptr<ChBody>, bool, const ChCoordsys<> &, const ChCoordsys<> &)"
               );
}

Assistant:

void ChLinkMarkers::Initialize(std::shared_ptr<ChBody> mbody1,
                               std::shared_ptr<ChBody> mbody2,
                               bool pos_are_relative,
                               const ChCoordsys<>& mpos1,
                               const ChCoordsys<>& mpos2) {
    assert(mbody1.get() != mbody2.get());
    assert(mbody1->GetSystem() == mbody2->GetSystem());

    // create markers to add to the two bodies
    std::shared_ptr<ChMarker> mmark1(new ChMarker);
    std::shared_ptr<ChMarker> mmark2(new ChMarker);
    mbody1->AddMarker(mmark1);
    mbody2->AddMarker(mmark2);

    ChMarker* mm1 = mmark1.get();
    ChMarker* mm2 = mmark2.get();
    ReferenceMarkers(mm1, mm2);

    if (pos_are_relative) {
        mmark1->Impose_Rel_Coord(mpos1);
        mmark2->Impose_Rel_Coord(mpos2);
    } else {
        mmark1->Impose_Abs_Coord(mpos1);
        mmark2->Impose_Abs_Coord(mpos2);
    }
}